

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O2

void __thiscall
tcu::TestNode::TestNode
          (TestNode *this,TestContext *testCtx,TestNodeType nodeType,char *name,char *description,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *children)

{
  pointer ppTVar1;
  int i;
  long lVar2;
  allocator<char> local_32;
  allocator<char> local_31;
  
  this->_vptr_TestNode = (_func_int **)&PTR__TestCase_01e749f8;
  this->m_testCtx = testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_description,description,&local_32);
  this->m_nodeType = nodeType;
  (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar2 = 0;
      ppTVar1 = (children->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(children->
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) >> 3)
      ; lVar2 = lVar2 + 1) {
    addChild(this,ppTVar1[lVar2]);
  }
  return;
}

Assistant:

TestNode::TestNode (TestContext& testCtx, TestNodeType nodeType, const char* name, const char* description, const vector<TestNode*>& children)
	: m_testCtx		(testCtx)
	, m_name		(name)
	, m_description	(description)
	, m_nodeType	(nodeType)
{
	DE_ASSERT(isValidCaseName(name));
	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}